

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::TestLazyMessageRepeated::_InternalSerialize
          (TestLazyMessageRepeated *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  ulong uVar2;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestLazyMessage>_> *value;
  uint8_t *puVar3;
  int index;
  
  iVar1 = *(int *)((long)&this->field_0 + 8);
  if (iVar1 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestLazyMessage>>
                        ((RepeatedPtrFieldBase *)&(this->field_0)._impl_,index);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (1,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                          stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestLazyMessageRepeated::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestLazyMessageRepeated& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestLazyMessageRepeated)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .edition_unittest.TestLazyMessage repeated_message = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_message_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_message().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestLazyMessageRepeated)
  return target;
}